

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void prvTidyRepairDuplicateAttributes(TidyDocImpl *doc,Node *node,Bool isXml)

{
  TidyAttrId TVar1;
  Attribute *pAVar2;
  TidyAllocator *pTVar3;
  _func_void_ptr_TidyAllocator_ptr_void_ptr_size_t *p_Var4;
  bool bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  tmbstr ptVar10;
  AttVal *av;
  AttVal *pAVar11;
  AttVal *av_00;
  char *str;
  bool bVar12;
  bool bVar13;
  AttVal *local_58;
  
  pAVar11 = node->attributes;
joined_r0x0013bd36:
  if (pAVar11 == (AttVal *)0x0) {
    return;
  }
  if ((pAVar11->asp == (Node *)0x0) && (pAVar11->php == (Node *)0x0)) goto code_r0x0013bd59;
  goto LAB_0013c0ac;
code_r0x0013bd59:
  if (pAVar11->next == (AttVal *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = false;
    av = pAVar11;
    av_00 = pAVar11->next;
    do {
      pAVar11 = av;
      if ((av_00->asp == (Node *)0x0) && (av_00->php == (Node *)0x0)) {
        if ((av == (AttVal *)0x0) || (av->dict == (Attribute *)0x0)) {
          bVar12 = false;
        }
        else {
          bVar12 = av->dict->id != TidyAttr_UNKNOWN;
        }
        pAVar2 = av_00->dict;
        if (pAVar2 == (Attribute *)0x0) {
          bVar13 = false;
        }
        else {
          bVar13 = pAVar2->id != TidyAttr_UNKNOWN;
        }
        if ((bool)(bVar12 & bVar13)) {
          if ((((av != (AttVal *)0x0) && (pAVar2 != (Attribute *)0x0)) &&
              (av->dict != (Attribute *)0x0)) && (TVar1 = av->dict->id, TVar1 != TidyAttr_UNKNOWN))
          {
            bVar12 = TVar1 == pAVar2->id;
            goto LAB_0013bdfa;
          }
          goto LAB_0013bd76;
        }
        if ((((bool)(bVar12 | bVar13)) || (av->attribute == (ctmbstr)0x0)) ||
           (av_00->attribute == (ctmbstr)0x0)) goto LAB_0013bd76;
        iVar7 = prvTidytmbstrcmp(av->attribute,av_00->attribute);
        bVar12 = iVar7 == 0;
LAB_0013bdfa:
        if (!bVar12) goto LAB_0013bd76;
        if (((isXml == no) && (av != (AttVal *)0x0)) &&
           (pAVar2 = av->dict, pAVar2 != (Attribute *)0x0)) {
          if ((((pAVar2->id == TidyAttr_CLASS) && (*(int *)((doc->config).value + 0x28) != 0)) &&
              (av->value != (tmbstr)0x0)) && (av_00->value != (ctmbstr)0x0)) {
            prvTidyAppendToClassAttr(doc,av,av_00->value);
          }
          else {
            if (((pAVar2 == (Attribute *)0x0) || (pAVar2->id != TidyAttr_STYLE)) ||
               ((*(int *)((doc->config).value + 0x29) == 0 ||
                ((av->value == (ctmbstr)0x0 || (str = av_00->value, str == (ctmbstr)0x0))))))
            goto LAB_0013bf17;
            uVar8 = prvTidytmbstrlen(av->value);
            lVar6 = (long)uVar8;
            if (uVar8 == 0) {
LAB_0013bf99:
              pTVar3 = doc->allocator;
              p_Var4 = pTVar3->vtbl->realloc;
              ptVar10 = av->value;
              uVar9 = prvTidytmbstrlen(str);
              ptVar10 = (tmbstr)(*p_Var4)(pTVar3,ptVar10,lVar6 + (long)uVar9 + 3);
              av->value = ptVar10;
              if (uVar8 != 0) {
                prvTidytmbstrcat(ptVar10,"; ");
              }
            }
            else {
              ptVar10 = av->value;
              if (ptVar10[uVar8 - 1] == '}') {
                pTVar3 = doc->allocator;
                p_Var4 = pTVar3->vtbl->realloc;
                uVar8 = prvTidytmbstrlen(str);
                ptVar10 = (tmbstr)(*p_Var4)(pTVar3,ptVar10,lVar6 + (long)uVar8 + 6);
                av->value = ptVar10;
                prvTidytmbstrcat(ptVar10," { ");
                prvTidytmbstrcat(av->value,str);
                str = " }";
              }
              else {
                if (ptVar10[uVar8 - 1] != ';') goto LAB_0013bf99;
                pTVar3 = doc->allocator;
                p_Var4 = pTVar3->vtbl->realloc;
                uVar8 = prvTidytmbstrlen(str);
                ptVar10 = (tmbstr)(*p_Var4)(pTVar3,ptVar10,lVar6 + (long)uVar8 + 2);
                av->value = ptVar10;
                prvTidytmbstrcat(ptVar10," ");
              }
            }
            prvTidytmbstrcat(av->value,str);
          }
          local_58 = av_00->next;
          prvTidyReportAttrError(doc,node,av_00,0x24e);
LAB_0013bf88:
          prvTidyRemoveAttribute(doc,node,av_00);
        }
        else {
LAB_0013bf17:
          if ((doc->config).value[0x12].v != 1) {
            local_58 = av_00->next;
            prvTidyReportAttrError(doc,node,av_00,0x272);
            goto LAB_0013bf88;
          }
          pAVar11 = av->next;
          prvTidyReportAttrError(doc,node,av,0x272);
          prvTidyRemoveAttribute(doc,node,av);
          local_58 = av_00->next;
          bVar5 = true;
        }
      }
      else {
LAB_0013bd76:
        local_58 = av_00->next;
      }
      av = pAVar11;
      av_00 = local_58;
    } while (local_58 != (AttVal *)0x0);
    bVar5 = !bVar5;
  }
  if (bVar5) {
LAB_0013c0ac:
    pAVar11 = pAVar11->next;
  }
  goto joined_r0x0013bd36;
}

Assistant:

void TY_(RepairDuplicateAttributes)( TidyDocImpl* doc, Node *node, Bool isXml )
{
    AttVal *first;

    for (first = node->attributes; first != NULL;)
    {
        AttVal *second;
        Bool firstRedefined = no;

        if (!(first->asp == NULL && first->php == NULL))
        {
            first = first->next;
            continue;
        }

        for (second = first->next; second != NULL;)
        {
            AttVal *temp;

            if (!(second->asp == NULL && second->php == NULL
                  && AttrsHaveSameName(first, second)))
            {
                second = second->next;
                continue;
            }

            /* first and second attribute have same local name */
            /* now determine what to do with this duplicate... */

            if (!isXml
                && attrIsCLASS(first) && cfgBool(doc, TidyJoinClasses)
                && AttrHasValue(first) && AttrHasValue(second))
            {
                /* concatenate classes */

                TY_(AppendToClassAttr)(doc, first, second->value);

                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, JOINING_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
            else if (!isXml
                     && attrIsSTYLE(first) && cfgBool(doc, TidyJoinStyles)
                     && AttrHasValue(first) && AttrHasValue(second))
            {
                AppendToStyleAttr( doc, first, second->value );

                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, JOINING_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
            else if ( cfg(doc, TidyDuplicateAttrs) == TidyKeepLast )
            {
                temp = first->next;
                TY_(ReportAttrError)( doc, node, first, REPEATED_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, first );
                firstRedefined = yes;
                first = temp;
                second = second->next;
            }
            else /* TidyDuplicateAttrs == TidyKeepFirst */
            {
                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, REPEATED_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
        }
        if (!firstRedefined)
            first = first->next;
    }
}